

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O2

Matrix4x4 * CMU462::Matrix4x4::translation(Vector3D *t)

{
  double dVar1;
  Matrix4x4 *B;
  Matrix4x4 *in_RDI;
  
  in_RDI->entries[0].x = 1.0;
  in_RDI->entries[0].y = 0.0;
  *(undefined4 *)&in_RDI->entries[1].x = 0;
  *(undefined4 *)((long)&in_RDI->entries[1].x + 4) = 0;
  *(undefined4 *)&in_RDI->entries[1].y = 0;
  *(undefined4 *)((long)&in_RDI->entries[1].y + 4) = 0x3ff00000;
  in_RDI->entries[2].x = 0.0;
  in_RDI->entries[2].y = 0.0;
  dVar1 = t->y;
  in_RDI->entries[3].x = t->x;
  in_RDI->entries[3].y = dVar1;
  in_RDI->entries[3].z = t->z;
  in_RDI->entries[0].z = 0.0;
  in_RDI->entries[0].w = 0.0;
  in_RDI->entries[1].z = 0.0;
  in_RDI->entries[1].w = 0.0;
  in_RDI->entries[2].z = 1.0;
  in_RDI->entries[2].w = 0.0;
  in_RDI->entries[3].w = 1.0;
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::translation(Vector3D t) {
    Matrix4x4 B;

    B(0, 0) = 1.; B(0, 1) = 0.; B(0, 2) = 0.; B(0, 3) = t.x;
    B(1, 0) = 0.; B(1, 1) = 1.; B(1, 2) = 0.; B(1, 3) = t.y;
    B(2, 0) = 0.; B(2, 1) = 0.; B(2, 2) = 1.; B(2, 3) = t.z;
    B(3, 0) = 0.; B(3, 1) = 0.; B(3, 2) = 0.; B(3, 3) = 1.;

    return B;
  }